

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::GetIDWithSeed(char *str,char *str_end,ImGuiID seed)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  
  if (str_end != (char *)0x0) {
    str_end = str_end + -(long)str;
  }
  IVar2 = ImHashStr(str,(size_t)str_end,seed);
  pIVar1 = GImGui;
  if (GImGui->ActiveId == IVar2) {
    GImGui->ActiveIdIsAlive = IVar2;
  }
  if (pIVar1->ActiveIdPreviousFrame == IVar2) {
    pIVar1->ActiveIdPreviousFrameIsAlive = true;
  }
  return IVar2;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(const char* str, const char* str_end, ImGuiID seed)
{
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}